

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

iterator __thiscall
ImVector<ImGuiSettingsHandler>::insert
          (ImVector<ImGuiSettingsHandler> *this,const_iterator it,value_type *v)

{
  bool bVar1;
  int new_capacity;
  long lVar2;
  ptrdiff_t off;
  value_type *v_local;
  const_iterator it_local;
  ImVector<ImGuiSettingsHandler> *this_local;
  
  bVar1 = false;
  if (this->Data <= it) {
    bVar1 = it <= this->Data + this->Size;
  }
  if (!bVar1) {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                  ,0x4e6,
                  "iterator ImVector<ImGuiSettingsHandler>::insert(const_iterator, const value_type &) [T = ImGuiSettingsHandler]"
                 );
  }
  lVar2 = ((long)it - (long)this->Data) / 0x30;
  if (this->Size == this->Capacity) {
    new_capacity = _grow_capacity(this,this->Size + 1);
    reserve(this,new_capacity);
  }
  if (lVar2 < this->Size) {
    memmove(this->Data + lVar2 + 1,this->Data + lVar2,(this->Size - lVar2) * 0x30);
  }
  memcpy(this->Data + lVar2,v,0x30);
  this->Size = this->Size + 1;
  return this->Data + lVar2;
}

Assistant:

inline iterator     insert(const_iterator it, const value_type& v)  { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(value_type)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }